

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::setIconProvider(QFileDialog *this,QAbstractFileIconProvider *provider)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QUrl> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((*(char *)(lVar1 + 0x2c8) == '\0') && (*(long *)(lVar1 + 0x370) != 0)) {
    QFileSystemModel::setIconProvider(*(QAbstractFileIconProvider **)(lVar1 + 0x300));
    lVar1 = *(long *)(*(long *)(lVar1 + 0x370) + 0x58);
    QUrlModel::urls((QList<QUrl> *)&local_30,*(QUrlModel **)(lVar1 + 0x28));
    QUrlModel::setUrls(*(QUrlModel **)(lVar1 + 0x28),(QList<QUrl> *)&local_30);
    QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setIconProvider(QAbstractFileIconProvider *provider)
{
    Q_D(QFileDialog);
    if (!d->usingWidgets())
        return;
    d->model->setIconProvider(provider);
    //It forces the refresh of all entries in the side bar, then we can get new icons
    d->qFileDialogUi->sidebar->setUrls(d->qFileDialogUi->sidebar->urls());
}